

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t Address_01;
  uint RegNo;
  DecodeStatus DVar5;
  
  RegNo = Insn >> 8 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  DVar3 = MCDisassembler_Success;
  Address_01 = Address_00;
  if (uVar2 == 0x988) {
    DVar3 = DecoderGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      if (DVar3 != MCDisassembler_Fail) {
        DVar3 = MCDisassembler_Success;
      }
      bVar1 = false;
    }
    Address_01 = extraout_RDX;
    if (!bVar1) {
      return MCDisassembler_Fail;
    }
  }
  DVar4 = DecoderGPRRegisterClass(Inst,RegNo,Address_01,Decoder);
  if (DVar4 == MCDisassembler_Fail) {
    bVar1 = false;
    DVar5 = DVar4;
  }
  else {
    bVar1 = true;
    DVar5 = DVar3;
    if ((DVar4 != MCDisassembler_Success) && (DVar5 = DVar4, DVar4 != MCDisassembler_SoftFail)) {
      bVar1 = false;
      DVar5 = DVar3;
    }
  }
  if (!bVar1) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateImm0
            (Inst,(ulong)(Insn >> 0xf & 0x800 | Insn >> 4 & 0xf000 | Insn >> 4 & 0x700 | Insn & 0xff
                         ));
  return DVar5;
}

Assistant:

static DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 8) << 0);
	imm |= (fieldFromInstruction_4(Insn, 12, 3) << 8);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);
	imm |= (fieldFromInstruction_4(Insn, 26, 1) << 11);

	if (MCInst_getOpcode(Inst) == ARM_t2MOVTi16)
		if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}